

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

type_info * get_type_info_entry(_Unwind_Context *context,dwarf_eh_lsda *lsda,int filter)

{
  dw_eh_ptr_t puVar1;
  int iVar2;
  uint64_t v;
  int64_t offset;
  dw_eh_ptr_t start;
  dw_eh_ptr_t record;
  dwarf_eh_lsda *pdStack_20;
  int filter_local;
  dwarf_eh_lsda *lsda_local;
  _Unwind_Context *context_local;
  
  puVar1 = lsda->type_table;
  record._4_4_ = filter;
  pdStack_20 = lsda;
  lsda_local = (dwarf_eh_lsda *)context;
  iVar2 = dwarf_size_of_fixed_size_field(lsda->type_table_encoding);
  iVar2 = iVar2 * record._4_4_;
  start = puVar1 + -(long)iVar2;
  v = read_value(pdStack_20->type_table_encoding,&start);
  if (v == 0) {
    context_local = (_Unwind_Context *)0x0;
  }
  else {
    context_local =
         (_Unwind_Context *)
         resolve_indirect_value
                   ((_Unwind_Context *)lsda_local,pdStack_20->type_table_encoding,v,
                    puVar1 + -(long)iVar2);
  }
  return (type_info *)context_local;
}

Assistant:

static std::type_info *get_type_info_entry(_Unwind_Context *context,
                                           dwarf_eh_lsda *lsda,
                                           int filter)
{
	// Get the address of the record in the table.
	dw_eh_ptr_t record = lsda->type_table - 
		dwarf_size_of_fixed_size_field(lsda->type_table_encoding)*filter;
	//record -= 4;
	dw_eh_ptr_t start = record;
	// Read the value, but it's probably an indirect reference...
	int64_t offset = read_value(lsda->type_table_encoding, &record);

	// (If the entry is 0, don't try to dereference it.  That would be bad.)
	if (offset == 0) { return 0; }

	// ...so we need to resolve it
	return reinterpret_cast<std::type_info*>(resolve_indirect_value(context,
			lsda->type_table_encoding, offset, start));
}